

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.h
# Opt level: O2

QVariant * __thiscall QModelRoleDataSpan::dataForRole(QModelRoleDataSpan *this,int role)

{
  QModelRoleData *pQVar1;
  QModelRoleData *pQVar2;
  QModelRoleData *pQVar3;
  long lVar4;
  
  pQVar3 = this->m_modelRoleData;
  lVar4 = this->m_len * 0x28;
  pQVar1 = pQVar3 + this->m_len;
  for (; (pQVar2 = pQVar1, lVar4 != 0 && (pQVar2 = pQVar3, pQVar3->m_role != role));
      pQVar3 = pQVar3 + 1) {
    lVar4 = lVar4 + -0x28;
  }
  return &pQVar2->m_data;
}

Assistant:

constexpr QModelRoleData *end() const noexcept { return m_modelRoleData + m_len; }